

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

StatusOr<google::protobuf::FeatureSet> *
google::protobuf::anon_unknown_0::GetDefaults
          (StatusOr<google::protobuf::FeatureSet> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *defaults)

{
  bool bVar1;
  Status *x;
  FeatureResolver *this;
  undefined1 local_130 [8];
  FeatureSet child;
  FeatureSet parent;
  Status local_80;
  Status _status;
  StatusOr<google::protobuf::FeatureResolver> resolver;
  FeatureSetDefaults *defaults_local;
  Edition edition_local;
  
  FeatureResolver::Create((StatusOr<google::protobuf::FeatureResolver> *)&_status,edition,defaults);
  x = absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::status
                ((StatusOr<google::protobuf::FeatureResolver> *)&_status);
  absl::lts_20250127::Status::Status(&local_80,x);
  bVar1 = absl::lts_20250127::Status::ok(&local_80);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::
    StatusOr<const_absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_80);
  }
  absl::lts_20250127::Status::~Status(&local_80);
  if (!bVar1) {
    FeatureSet::FeatureSet((FeatureSet *)((long)&child.field_0 + 0x38));
    FeatureSet::FeatureSet((FeatureSet *)local_130);
    this = absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::operator->
                     ((StatusOr<google::protobuf::FeatureResolver> *)&_status);
    FeatureResolver::MergeFeatures
              (__return_storage_ptr__,this,(FeatureSet *)((long)&child.field_0 + 0x38),
               (FeatureSet *)local_130);
    FeatureSet::~FeatureSet((FeatureSet *)local_130);
    FeatureSet::~FeatureSet((FeatureSet *)((long)&child.field_0 + 0x38));
  }
  absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::~StatusOr
            ((StatusOr<google::protobuf::FeatureResolver> *)&_status);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSet> GetDefaults(Edition edition,
                                       const FeatureSetDefaults& defaults) {
  absl::StatusOr<FeatureResolver> resolver =
      FeatureResolver::Create(edition, defaults);
  RETURN_IF_ERROR(resolver.status());
  FeatureSet parent, child;
  return resolver->MergeFeatures(parent, child);
}